

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoMocUic.cxx
# Opt level: O0

bool __thiscall cmQtAutoMocUic::JobParseT::ReadFile(JobParseT *this)

{
  bool bVar1;
  element_type *peVar2;
  element_type *this_00;
  Logger *pLVar3;
  ulong uVar4;
  allocator<char> local_d9;
  string local_d8;
  uint local_b4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  undefined1 local_90 [8];
  string error;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  element_type *local_20;
  string *fileName;
  JobParseT *this_local;
  
  fileName = (string *)this;
  peVar2 = std::
           __shared_ptr_access<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->FileHandle);
  this_00 = std::
            __shared_ptr_access<cmQtAutoMocUic::ParseCacheT::FileT,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<cmQtAutoMocUic::ParseCacheT::FileT,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&peVar2->ParseData);
  ParseCacheT::FileT::Clear(this_00);
  local_20 = std::
             __shared_ptr_access<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->FileHandle);
  pLVar3 = JobT::Log(&this->super_JobT);
  bVar1 = cmQtAutoGenerator::Logger::Verbose(pLVar3);
  if (bVar1) {
    pLVar3 = JobT::Log(&this->super_JobT);
    cmQtAutoGen::Quoted(&local_60,&local_20->FileName);
    std::operator+(&local_40,"Parsing ",&local_60);
    cmQtAutoGenerator::Logger::Info(pLVar3,GEN,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
  }
  std::__cxx11::string::string((string *)local_90);
  bVar1 = cmQtAutoGenerator::FileRead(&this->Content,&local_20->FileName,(string *)local_90);
  peVar2 = local_20;
  if (!bVar1) {
    std::operator+(&local_b0,"Could not read the file: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90);
    JobT::LogFileError(&this->super_JobT,GEN,&peVar2->FileName,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    this_local._7_1_ = 0;
  }
  local_b4 = (uint)!bVar1;
  std::__cxx11::string::~string((string *)local_90);
  if (local_b4 == 0) {
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      this_local._7_1_ = 1;
    }
    else {
      pLVar3 = JobT::Log(&this->super_JobT);
      peVar2 = local_20;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d8,"The file is empty.",&local_d9);
      cmQtAutoGenerator::Logger::WarningFile(pLVar3,GEN,&peVar2->FileName,&local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::allocator<char>::~allocator(&local_d9);
      this_local._7_1_ = 0;
    }
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmQtAutoMocUic::JobParseT::ReadFile()
{
  // Clear old parse information
  FileHandle->ParseData->Clear();
  std::string const& fileName = FileHandle->FileName;
  // Write info
  if (Log().Verbose()) {
    Log().Info(GenT::GEN, "Parsing " + Quoted(fileName));
  }
  // Read file content
  {
    std::string error;
    if (!cmQtAutoGenerator::FileRead(Content, fileName, &error)) {
      LogFileError(GenT::GEN, fileName, "Could not read the file: " + error);
      return false;
    }
  }
  // Warn if empty
  if (Content.empty()) {
    Log().WarningFile(GenT::GEN, fileName, "The file is empty.");
    return false;
  }
  return true;
}